

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

bool RunCommand(char *comment,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *command,bool verbose,NumberFormat exitFormat,int *retCodeOut,
               _func_bool_int *retCodeOkay)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  undefined7 in_register_00000011;
  int retCode;
  char *local_80;
  string output;
  string local_58;
  NumberFormatter local_38;
  
  local_80 = comment;
  if ((int)CONCAT71(in_register_00000011,verbose) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,comment);
    std::operator<<(poVar4,":\n");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&output,command," ");
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)&output);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&output);
  }
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  retCode = 0;
  bVar1 = cmSystemTools::RunSingleCommand
                    (command,&output,&output,&retCode,(char *)0x0,OUTPUT_NONE,(cmDuration)0x0,Auto);
  if (retCode == 0) {
    bVar2 = true;
  }
  else if (retCodeOkay == (_func_bool_int *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = (*retCodeOkay)(retCode);
  }
  if (retCodeOut != (int *)0x0) {
    iVar3 = -1;
    if (bVar2 == false) {
      iVar3 = retCode;
    }
    if (bVar1) {
      iVar3 = retCode;
    }
    *retCodeOut = iVar3;
  }
  if ((bool)(bVar1 & bVar2) == false) {
    poVar4 = std::operator<<((ostream *)&std::cout,local_80);
    poVar4 = std::operator<<(poVar4,": command \"");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_58,command," ");
    poVar4 = std::operator<<(poVar4,(string *)&local_58);
    poVar4 = std::operator<<(poVar4,"\" failed (exit code ");
    local_38.Value = retCode;
    local_38.Format = exitFormat;
    operator<<(poVar4,&local_38);
    poVar4 = std::operator<<(poVar4,") with the following output:\n");
    std::operator<<(poVar4,(string *)&output);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    lVar5 = std::__cxx11::string::find((char *)&output,0x3f090a);
    if (lVar5 == -1) {
      std::operator<<((ostream *)&std::cout,(string *)&output);
    }
  }
  std::__cxx11::string::~string((string *)&output);
  return (bool)(bVar1 & bVar2);
}

Assistant:

static bool RunCommand(const char* comment, std::vector<std::string>& command,
                       bool verbose, NumberFormat exitFormat,
                       int* retCodeOut = nullptr,
                       bool (*retCodeOkay)(int) = nullptr)
{
  if (verbose) {
    std::cout << comment << ":\n";
    std::cout << cmJoin(command, " ") << "\n";
  }
  std::string output;
  int retCode = 0;
  bool commandResult = cmSystemTools::RunSingleCommand(
    command, &output, &output, &retCode, nullptr, cmSystemTools::OUTPUT_NONE);
  bool const retCodeSuccess =
    retCode == 0 || (retCodeOkay && retCodeOkay(retCode));
  bool const success = commandResult && retCodeSuccess;
  if (retCodeOut) {
    if (commandResult || !retCodeSuccess) {
      *retCodeOut = retCode;
    } else {
      *retCodeOut = -1;
    }
  }
  if (!success) {
    std::cout << comment << ": command \"" << cmJoin(command, " ")
              << "\" failed (exit code "
              << NumberFormatter(exitFormat, retCode)
              << ") with the following output:\n"
              << output;
  } else {
    // always print the output of the command, unless
    // it is the dumb rc command banner
    if (output.find("Resource Compiler Version") == std::string::npos) {
      std::cout << output;
    }
  }
  return success;
}